

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O1

void set_mem_access(MCInst *MI,_Bool status,int reg)

{
  anon_union_1480_8_3a70395c_for_cs_detail_6 *paVar1;
  cs_detail *pcVar2;
  uint8_t *puVar3;
  
  if (MI->csh->detail == CS_OPT_ON) {
    MI->csh->doing_mem = status;
    if (status) {
      if ((reg != -0xffff) && (reg != 0xffff)) {
        pcVar2 = MI->flat_insn->detail;
        puVar3 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x12;
        puVar3[0] = '\x03';
        puVar3[1] = '\0';
        puVar3[2] = '\0';
        puVar3[3] = '\0';
        pcVar2 = MI->flat_insn->detail;
        pcVar2->groups[(ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x16] = (uint8_t)reg;
        pcVar2 = MI->flat_insn->detail;
        pcVar2->groups[(ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x17] = '\0';
        pcVar2 = MI->flat_insn->detail;
        puVar3 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x1a;
        puVar3[0] = '\0';
        puVar3[1] = '\0';
        puVar3[2] = '\0';
        puVar3[3] = '\0';
        pcVar2 = MI->flat_insn->detail;
        puVar3 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x1e;
        puVar3[0] = '\x01';
        puVar3[1] = '\0';
        puVar3[2] = '\0';
        puVar3[3] = '\0';
        return;
      }
      paVar1 = &MI->flat_insn->detail->field_6;
      (paVar1->x86).prefix[0] = (paVar1->x86).prefix[0] + 0xff;
      pcVar2 = MI->flat_insn->detail;
      puVar3 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x12;
      puVar3[0] = '\x03';
      puVar3[1] = '\0';
      puVar3[2] = '\0';
      puVar3[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      pcVar2->groups[(ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x17] = '\0';
      pcVar2 = MI->flat_insn->detail;
      puVar3 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x1a;
      puVar3[0] = '\0';
      puVar3[1] = '\0';
      puVar3[2] = '\0';
      puVar3[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      puVar3 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x1e;
      if (0 < reg) {
        puVar3[0] = '\x01';
        puVar3[1] = '\0';
        puVar3[2] = '\0';
        puVar3[3] = '\0';
        return;
      }
      puVar3[0] = 0xff;
      puVar3[1] = 0xff;
      puVar3[2] = 0xff;
      puVar3[3] = 0xff;
      return;
    }
    if (reg != 0) {
      pcVar2 = MI->flat_insn->detail;
      pcVar2->groups[(ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x17] = (uint8_t)reg;
    }
    paVar1 = &MI->flat_insn->detail->field_6;
    (paVar1->x86).prefix[0] = (paVar1->x86).prefix[0] + '\x01';
  }
  return;
}

Assistant:

static void set_mem_access(MCInst *MI, bool status)
{
	if (MI->csh->detail != CS_OPT_ON)
		return;

	MI->csh->doing_mem = status;
	if (status) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_MEM;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = ARM_REG_INVALID;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.index = ARM_REG_INVALID;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.scale = 1;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.disp = 0;
	} else {
		// done, create the next operand slot
		MI->flat_insn->detail->arm.op_count++;
	}
}